

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O0

void __thiscall
zmq::radio_t::xattach_pipe
          (radio_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  byte bVar1;
  byte in_CL;
  byte bVar2;
  byte in_DL;
  pipe_t *in_RSI;
  pipe_t *in_stack_000000b8;
  radio_t *in_stack_000000c0;
  undefined6 in_stack_ffffffffffffffe8;
  
  bVar2 = in_DL & 1;
  bVar1 = in_CL & 1;
  if (in_RSI == (pipe_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radio.cpp"
            ,0x39);
    fflush(_stderr);
    zmq_abort((char *)0x2ec271);
  }
  pipe_t::set_nodelay(in_RSI);
  dist_t::attach((dist_t *)in_RSI,
                 (pipe_t *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe8)));
  if ((bVar2 & 1) == 0) {
    xread_activated(in_stack_000000c0,in_stack_000000b8);
  }
  else {
    std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::push_back
              ((vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *)in_RSI,
               (value_type *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe8)));
  }
  return;
}

Assistant:

void zmq::radio_t::xattach_pipe (pipe_t *pipe_,
                                 bool subscribe_to_all_,
                                 bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_);

    //  Don't delay pipe termination as there is no one
    //  to receive the delimiter.
    pipe_->set_nodelay ();

    _dist.attach (pipe_);

    if (subscribe_to_all_)
        _udp_pipes.push_back (pipe_);
    //  The pipe is active when attached. Let's read the subscriptions from
    //  it, if any.
    else
        xread_activated (pipe_);
}